

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O3

GLXFBConfig get_fbconfig_for_visinfo(Display *dpy,XVisualInfo *visinfo)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  long lVar3;
  GLXFBConfig p_Var4;
  int nconfigs;
  int v;
  undefined8 local_38;
  
  local_38 = in_RAX;
  lVar2 = (*_epoxy_glXGetFBConfigs)(dpy,visinfo->screen,&local_38);
  if (lVar2 == 0) {
    p_Var4 = (GLXFBConfig)0x0;
  }
  else {
    if (0 < (int)local_38) {
      lVar3 = 0;
      do {
        iVar1 = (*_epoxy_glXGetFBConfigAttrib)
                          (dpy,*(undefined8 *)(lVar2 + lVar3 * 8),0x800b,(long)&local_38 + 4);
        if ((iVar1 == 0) && (local_38._4_4_ == (int)visinfo->visualid)) {
          p_Var4 = *(GLXFBConfig *)(lVar2 + lVar3 * 8);
          goto LAB_00101456;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)local_38);
    }
    p_Var4 = (GLXFBConfig)0x0;
LAB_00101456:
    XFree(lVar2);
  }
  return p_Var4;
}

Assistant:

GLXFBConfig
get_fbconfig_for_visinfo(Display *dpy, XVisualInfo *visinfo)
{
	int i, nconfigs;
	GLXFBConfig ret = None, *configs;

	configs = glXGetFBConfigs(dpy, visinfo->screen, &nconfigs);
	if (!configs)
		return None;

	for (i = 0; i < nconfigs; i++) {
		int v;

		if (glXGetFBConfigAttrib(dpy, configs[i], GLX_VISUAL_ID, &v))
			continue;

		if (v == (int)visinfo->visualid) {
			ret = configs[i];
			break;
		}
	}

	XFree(configs);
	return ret;
}